

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

void __thiscall Triangle::_calculateNormal(Triangle *this)

{
  tvec3<float> local_40;
  tvec3<float> local_34;
  tvec3<float> local_28;
  tvec3<float> local_1c;
  Triangle *local_10;
  Triangle *this_local;
  
  local_10 = this;
  glm::detail::operator-((detail *)&local_34,&this->v1,&this->v0);
  glm::detail::operator-((detail *)&local_40,&this->v2,&this->v0);
  glm::cross<float>((glm *)&local_28,&local_34,&local_40);
  glm::normalize<float>((glm *)&local_1c,&local_28);
  glm::detail::tvec3<float>::operator=(&this->n,&local_1c);
  return;
}

Assistant:

void Triangle::_calculateNormal() { 
    n = glm::normalize(glm::cross((v1-v0), (v2-v0)));
    
//     std::cout << "normal: (" << n.x << ", " << n.y << ", " << n.z << ")" << std::endl;
}